

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

int __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_SparsityPrinter>::
ReadNumArgs(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_SparsityPrinter>
            *this,int min_args)

{
  int iVar1;
  
  iVar1 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(this->reader_);
  if (iVar1 < min_args) {
    BinaryReaderBase::ReportError<>(&this->reader_->super_BinaryReaderBase,(CStringRef)0x12cf79);
  }
  return iVar1;
}

Assistant:

int ReadNumArgs(int min_args = MIN_ITER_ARGS) {
    int num_args = reader_.ReadUInt();
    if (num_args < min_args)
      reader_.ReportError("too few arguments");
    return num_args;
  }